

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ostream * Catch::clara::TextFlow::operator<<(ostream *os,Columns *cols)

{
  bool bVar1;
  bool bVar2;
  ostream *in_RDI;
  long in_FS_OFFSET;
  iterator *in_stack_00000010;
  iterator __end3;
  iterator __begin3;
  Columns *__range3;
  bool first;
  string line;
  iterator *in_stack_ffffffffffffff48;
  iterator *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  iterator *in_stack_ffffffffffffff90;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = true;
  Columns::begin((Columns *)in_stack_ffffffffffffff48);
  Columns::end((Columns *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  while( true ) {
    bVar2 = Columns::iterator::operator!=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (!bVar2) break;
    Columns::iterator::operator*[abi_cxx11_(in_stack_00000010);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      ::std::operator<<(in_RDI,"\n");
    }
    ::std::operator<<(in_RDI,local_28);
    ::std::__cxx11::string::~string(local_28);
    Columns::iterator::operator++(in_stack_ffffffffffffff90);
  }
  Columns::iterator::~iterator((iterator *)0x273785);
  Columns::iterator::~iterator((iterator *)0x27378f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline friend std::ostream& operator << (std::ostream& os, Columns const& cols) {

		bool first = true;
		for (auto line : cols) {
			if (first)
				first = false;
			else
				os << "\n";
			os << line;
		}
		return os;
	}